

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImgDisplay * __thiscall
cimg_library::CImgDisplay::assign
          (CImgDisplay *this,uint dimw,uint dimh,char *title,uint normalization_type,
          bool fullscreen_flag,bool closed_flag)

{
  void *__s;
  X11_static *pXVar1;
  long local_58;
  bool closed_flag_local;
  bool fullscreen_flag_local;
  uint normalization_type_local;
  char *title_local;
  uint dimh_local;
  uint dimw_local;
  CImgDisplay *this_local;
  
  if ((dimw == 0) || (dimh == 0)) {
    this_local = assign(this);
  }
  else {
    _assign(this,dimw,dimh,title,normalization_type,fullscreen_flag,closed_flag);
    this->_max = 0.0;
    this->_min = 0.0;
    __s = this->_data;
    pXVar1 = cimg::X11_attr();
    if (pXVar1->nb_bits == 8) {
      local_58 = 1;
    }
    else {
      pXVar1 = cimg::X11_attr();
      local_58 = 4;
      if (pXVar1->nb_bits == 0x10) {
        local_58 = 2;
      }
    }
    memset(__s,0,local_58 * (ulong)this->_width * (ulong)this->_height);
    this_local = paint(this,true);
  }
  return this_local;
}

Assistant:

CImgDisplay& assign(const unsigned int dimw, const unsigned int dimh, const char *const title=0,
                        const unsigned int normalization_type=3,
                        const bool fullscreen_flag=false, const bool closed_flag=false) {
      if (!dimw || !dimh) return assign();
      _assign(dimw,dimh,title,normalization_type,fullscreen_flag,closed_flag);
      _min = _max = 0;
      std::memset(_data,0,(cimg::X11_attr().nb_bits==8?sizeof(unsigned char):
                           (cimg::X11_attr().nb_bits==16?sizeof(unsigned short):sizeof(unsigned int)))*
                  (size_t)_width*_height);
      return paint();
    }